

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char value,format_specs *specs)

{
  presentation_type pVar1;
  basic_appender<char> bVar2;
  anon_class_2_2_bf5026b7 local_3a;
  buffer<char> *local_38;
  undefined1 local_29;
  format_specs *pfStack_28;
  bool is_debug;
  format_specs *specs_local;
  basic_appender<char> bStack_18;
  char value_local;
  basic_appender<char> out_local;
  
  pfStack_28 = specs;
  specs_local._7_1_ = value;
  bStack_18.container = out.container;
  pVar1 = basic_specs::type(&specs->super_basic_specs);
  local_3a.is_debug = pVar1 == debug;
  local_38 = bStack_18.container;
  local_3a.value = specs_local._7_1_;
  local_29 = local_3a.is_debug;
  bVar2 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (bStack_18,pfStack_28,1,&local_3a);
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write_char(OutputIt out, Char value,
                              const format_specs& specs) -> OutputIt {
  bool is_debug = specs.type() == presentation_type::debug;
  return write_padded<Char>(out, specs, 1, [=](reserve_iterator<OutputIt> it) {
    if (is_debug) return write_escaped_char(it, value);
    *it++ = value;
    return it;
  });
}